

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

sysbvm_tuple_t sysbvm_tuple_asString(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  sysbvm_tuple_t sVar1;
  
  sVar1 = sysbvm_tuple_getType(context,tuple);
  if (sVar1 == (context->roots).stringType) {
    return tuple;
  }
  sVar1 = sysbvm_type_getAsStringFunction(context,sVar1);
  if (sVar1 != 0) {
    sVar1 = sysbvm_function_apply1(context,sVar1,tuple);
    return sVar1;
  }
  sVar1 = sysbvm_tuple_printString(context,tuple);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_asString(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    sysbvm_tuple_t type = sysbvm_tuple_getType(context, tuple);
    if(type == context->roots.stringType)
        return tuple;
    sysbvm_tuple_t asStringFunction = sysbvm_type_getAsStringFunction(context, type);
    if(asStringFunction == SYSBVM_NULL_TUPLE)
        return sysbvm_tuple_defaultAsString(context, tuple);
    return sysbvm_function_apply1(context, asStringFunction, tuple);
}